

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

void __thiscall
cbtCollisionWorld::debugDrawObject
          (cbtCollisionWorld *this,cbtTransform *worldTransform,cbtCollisionShape *shape,
          cbtVector3 *color)

{
  int *piVar1;
  cbtScalar cVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  cbtScalar cVar10;
  cbtScalar cVar11;
  cbtScalar cVar12;
  cbtScalar cVar13;
  cbtScalar cVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  int iVar17;
  void *pvVar18;
  double *pdVar19;
  ulong *puVar20;
  ulong *puVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  long lVar25;
  cbtCollisionShape *pcVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar30;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long *plVar31;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  long lVar32;
  ulong uVar33;
  cbtConvexTriangleMeshShape *convexMesh;
  long lVar34;
  cbtBoxShape *boxShape;
  long lVar35;
  code *UNRECOVERED_JUMPTABLE;
  int v;
  long lVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float in_XMM0_Da;
  float fVar50;
  float fVar51;
  ulong uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [12];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_ZMM3 [64];
  float fVar61;
  undefined1 auVar63 [12];
  undefined1 auVar62 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  cbtVector3 b;
  cbtConcaveShape *concaveMesh;
  cbtVector3 wa;
  cbtVector3 halfExtents;
  cbtVector3 wb;
  float local_148;
  float fStack_144;
  float local_138;
  float fStack_134;
  undefined1 local_128 [16];
  undefined1 local_118 [8];
  undefined8 uStack_110;
  cbtCollisionShape *local_108;
  cbtVector3 *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  long local_e8;
  float local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  cbtInternalTriangleIndexCallback cStack_c0;
  undefined8 local_b8;
  ulong local_b0;
  undefined8 uStack_a8;
  ulong local_a0;
  undefined1 auStack_98 [16];
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  cbtCollisionWorld *local_60;
  ulong local_58;
  undefined8 uStack_50;
  long local_48;
  undefined1 local_40 [16];
  undefined4 extraout_var_07;
  
  auVar45 = in_ZMM16._0_16_;
  auVar63 = in_ZMM5._4_12_;
  auVar60 = in_ZMM3._4_12_;
  iVar27 = (*this->_vptr_cbtCollisionWorld[5])();
  if (CONCAT44(extraout_var,iVar27) != 0) {
    iVar27 = (*this->_vptr_cbtCollisionWorld[5])(this);
    in_XMM0_Da = (float)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar27) + 0x70))
                                  ((long *)CONCAT44(extraout_var_00,iVar27));
  }
  iVar27 = shape->m_shapeType;
  if (0x21 < iVar27) {
    if (iVar27 == 0x22) {
      uVar15 = *(undefined4 *)&shape[2].m_userPointer;
      iVar27 = (*this->_vptr_cbtCollisionWorld[5])(this);
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)CONCAT44(extraout_var_12,iVar27) + 0xc0);
      (*UNRECOVERED_JUMPTABLE)
                (uVar15,(long *)CONCAT44(extraout_var_12,iVar27),shape + 2,worldTransform,color,
                 UNRECOVERED_JUMPTABLE);
      return;
    }
    if (iVar27 == 0x25) {
      lVar34 = (long)*(int *)((long)&shape[1]._vptr_cbtCollisionShape + 4);
      if (lVar34 < 1) {
        return;
      }
      uVar33 = lVar34 + 1;
      lVar34 = lVar34 * 0x58 + -0x18;
      do {
        pvVar18 = shape[1].m_userPointer;
        fVar50 = (worldTransform->m_basis).m_el[0].m_floats[1];
        fVar51 = (worldTransform->m_basis).m_el[1].m_floats[1];
        auVar37 = vbroadcastss_avx512vl
                            (ZEXT416((uint)(worldTransform->m_basis).m_el[2].m_floats[1]));
        cVar2 = (worldTransform->m_basis).m_el[0].m_floats[0];
        auVar64._4_4_ = cVar2;
        auVar64._0_4_ = cVar2;
        auVar64._8_4_ = cVar2;
        auVar64._12_4_ = cVar2;
        auVar38 = vbroadcastss_avx512vl
                            (ZEXT416((uint)(worldTransform->m_basis).m_el[1].m_floats[0]));
        auVar39 = vbroadcastss_avx512vl
                            (ZEXT416((uint)(worldTransform->m_basis).m_el[2].m_floats[0]));
        cVar2 = (worldTransform->m_basis).m_el[0].m_floats[2];
        auVar65._4_4_ = cVar2;
        auVar65._0_4_ = cVar2;
        auVar65._8_4_ = cVar2;
        auVar65._12_4_ = cVar2;
        auVar40 = vbroadcastss_avx512vl
                            (ZEXT416((uint)(worldTransform->m_basis).m_el[1].m_floats[2]));
        fVar5 = *(float *)((long)pvVar18 + lVar34 + -0x28);
        uVar29 = *(uint *)((long)pvVar18 + lVar34 + -0x38);
        uVar52 = *(ulong *)((long)pvVar18 + lVar34 + -0x30);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = uVar52;
        uVar9 = *(uint *)((long)pvVar18 + lVar34 + -0x18);
        fVar6 = *(float *)((long)pvVar18 + lVar34 + -0xc);
        uVar3 = *(uint *)((long)pvVar18 + lVar34 + -0x10);
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)((long)pvVar18 + lVar34 + -0x40);
        uVar4 = *(uint *)((long)pvVar18 + lVar34 + -8);
        auVar49._8_8_ = 0;
        auVar49._0_8_ = *(ulong *)((long)pvVar18 + lVar34 + -0x20);
        auVar45 = vmulss_avx512f(ZEXT416((uint)fVar5),auVar37);
        auVar47._0_4_ = fVar50 * (float)uVar52;
        fVar7 = (float)(uVar52 >> 0x20);
        auVar47._4_4_ = fVar50 * fVar7;
        auVar47._8_4_ = fVar50 * 0.0;
        auVar47._12_4_ = fVar50 * 0.0;
        auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar5)),ZEXT416(uVar29),auVar64);
        auVar41 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar51 * fVar5)),ZEXT416(uVar29),auVar38);
        auVar42 = vfmadd231ss_avx512f(auVar45,auVar39,ZEXT416(uVar29));
        cVar2 = (worldTransform->m_basis).m_el[2].m_floats[2];
        auVar58._4_4_ = cVar2;
        auVar58._0_4_ = cVar2;
        auVar58._8_4_ = cVar2;
        auVar58._12_4_ = cVar2;
        auVar45 = vfmadd231ps_fma(auVar47,auVar48,auVar64);
        auVar47 = vfmadd231ss_fma(auVar46,ZEXT416(uVar9),auVar65);
        auVar43 = vfmadd231ss_avx512f(auVar41,ZEXT416(uVar9),auVar40);
        auVar46 = vfmadd231ps_fma(auVar45,auVar49,auVar65);
        auVar41 = vfmadd231ss_fma(auVar42,auVar58,ZEXT416(uVar9));
        auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar6)),ZEXT416(uVar3),auVar64);
        auVar42 = vmulss_avx512f(ZEXT416((uint)fVar6),auVar37);
        auVar44 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar51 * fVar6)),ZEXT416(uVar3),auVar38);
        auVar42 = vfmadd231ss_avx512f(auVar42,auVar39,ZEXT416(uVar3));
        auVar45 = vfmadd231ss_fma(auVar45,ZEXT416(uVar4),auVar65);
        auVar44 = vfmadd231ss_avx512f(auVar44,ZEXT416(uVar4),auVar40);
        auVar42 = vfmadd231ss_fma(auVar42,auVar58,ZEXT416(uVar4));
        auVar45 = vinsertps_avx(ZEXT416((uint)(auVar45._0_4_ +
                                              (worldTransform->m_origin).m_floats[0])),
                                ZEXT416((uint)(auVar44._0_4_ +
                                              (worldTransform->m_origin).m_floats[1])),0x10);
        auVar44._0_4_ = fVar51 * (float)uVar52;
        auVar44._4_4_ = fVar51 * fVar7;
        auVar44._8_4_ = fVar51 * 0.0;
        auVar44._12_4_ = fVar51 * 0.0;
        auVar37 = vmulps_avx512vl(auVar57,auVar37);
        local_c8 = (undefined1  [8])vmovlps_avx(auVar46);
        cStack_c0._vptr_cbtInternalTriangleIndexCallback._0_4_ = auVar47._0_4_;
        cStack_c0._vptr_cbtInternalTriangleIndexCallback._4_4_ = 0;
        auVar46 = vfmadd231ps_avx512vl(auVar44,auVar48,auVar38);
        auVar47 = vfmadd231ps_avx512vl(auVar37,auVar48,auVar39);
        auVar37 = vfmadd231ps_avx512vl(auVar46,auVar49,auVar40);
        auVar46 = vfmadd231ps_fma(auVar47,auVar49,auVar58);
        auStack_98 = vinsertps_avx(auVar45,ZEXT416((uint)(auVar42._0_4_ +
                                                         (worldTransform->m_origin).m_floats[2])),
                                   0x28);
        local_b8 = vmovlps_avx(auVar37);
        local_b0 = (ulong)auVar43._0_4_;
        uStack_a8 = vmovlps_avx(auVar46);
        local_a0 = (ulong)auVar41._0_4_;
        (*this->_vptr_cbtCollisionWorld[7])
                  (this,local_c8,*(undefined8 *)((long)pvVar18 + lVar34),color);
        uVar33 = uVar33 - 1;
        lVar34 = lVar34 + -0x58;
      } while (1 < uVar33);
      return;
    }
    goto switchD_008add2c_caseD_c;
  }
  switch(iVar27) {
  case 8:
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    iVar27 = (*this->_vptr_cbtCollisionWorld[5])(this);
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)CONCAT44(extraout_var_01,iVar27) + 0x30);
    (*UNRECOVERED_JUMPTABLE)
              (in_XMM0_Da,(long *)CONCAT44(extraout_var_01,iVar27),worldTransform,color,
               UNRECOVERED_JUMPTABLE);
    return;
  case 9:
    lVar34 = (long)*(int *)&shape[3].field_0xc;
    if (lVar34 < 1) {
      return;
    }
    uVar33 = lVar34 + 1;
    lVar34 = lVar34 << 4;
    local_100 = color;
    do {
      auVar45 = in_ZMM18._0_16_;
      auVar46 = in_ZMM19._0_16_;
      lVar30 = *(long *)&shape[3].m_userIndex;
      uVar29 = *(uint *)(lVar30 + -0x10 + lVar34);
      uVar9 = *(uint *)(lVar30 + -0xc + lVar34);
      uVar3 = *(uint *)(lVar30 + -8 + lVar34);
      iVar27 = (*this->_vptr_cbtCollisionWorld[5])(this);
      fVar50 = (worldTransform->m_basis).m_el[0].m_floats[0];
      cVar2 = (worldTransform->m_basis).m_el[0].m_floats[1];
      cVar10 = (worldTransform->m_basis).m_el[1].m_floats[1];
      fVar51 = (worldTransform->m_basis).m_el[1].m_floats[0];
      auVar47 = vxorps_avx512vl(auVar46,auVar46);
      in_ZMM19 = ZEXT1664(auVar47);
      fVar5 = (worldTransform->m_basis).m_el[0].m_floats[2];
      fVar6 = (worldTransform->m_basis).m_el[1].m_floats[2];
      cVar11 = (worldTransform->m_basis).m_el[2].m_floats[1];
      cVar12 = (worldTransform->m_basis).m_el[2].m_floats[0];
      cVar13 = (worldTransform->m_basis).m_el[2].m_floats[2];
      auVar41 = vxorps_avx512vl(auVar45,auVar45);
      auVar45 = vfmadd213ss_fma(ZEXT816(0) << 0x40,ZEXT416((uint)fVar50),ZEXT416((uint)cVar2));
      auVar42 = vmulss_avx512f(ZEXT416((uint)cVar2),auVar47);
      auVar37 = vmulss_avx512f(ZEXT416(uVar9),ZEXT416((uint)cVar2));
      auVar38 = vmulss_avx512f(ZEXT416((uint)cVar10),auVar47);
      auVar39 = vmulss_avx512f(ZEXT416((uint)cVar11),auVar47);
      auVar46 = vfmadd213ss_fma(ZEXT816(0) << 0x40,ZEXT416((uint)fVar51),ZEXT416((uint)cVar10));
      auVar41 = vfmadd213ss_avx512f(auVar41,ZEXT416((uint)cVar12),ZEXT416((uint)cVar11));
      auVar40 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)fVar50),auVar47);
      auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416(uVar29),ZEXT416((uint)fVar50));
      auVar43 = vmulss_avx512f(ZEXT416(uVar9),ZEXT416((uint)cVar10));
      auVar44 = vaddss_avx512f(ZEXT416((uint)cVar12),auVar39);
      auVar48 = vfmadd231ss_avx512f(auVar38,ZEXT416((uint)fVar51),auVar47);
      auVar39 = vfmadd231ss_avx512f(auVar39,ZEXT416((uint)cVar12),auVar47);
      auVar49 = vfmadd231ss_avx512f(auVar45,ZEXT416((uint)fVar5),auVar47);
      auVar46 = vfmadd231ss_avx512f(auVar46,ZEXT416((uint)fVar6),auVar47);
      auVar41 = vfmadd231ss_avx512f(auVar41,ZEXT416((uint)cVar13),auVar47);
      in_ZMM18 = ZEXT1664(auVar41);
      auVar45 = vfmadd231ss_avx512f(auVar43,ZEXT416(uVar29),ZEXT416((uint)fVar51));
      auVar42 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar50 + auVar42._0_4_)),ZEXT416((uint)fVar5),
                                    auVar47);
      auVar38 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar38._0_4_ + fVar51)),ZEXT416((uint)fVar6),
                                    auVar47);
      auVar47 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar13),auVar47);
      auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416(uVar3),ZEXT416((uint)fVar5));
      auVar43 = vmulss_avx512f(ZEXT416(uVar9),ZEXT416((uint)cVar11));
      auVar39 = vaddss_avx512f(ZEXT416((uint)cVar13),auVar39);
      auVar45 = vfmadd231ss_avx512f(auVar45,ZEXT416(uVar3),ZEXT416((uint)fVar6));
      auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416(uVar29),ZEXT416((uint)cVar12));
      auVar43 = vfmadd231ss_avx512f(auVar43,ZEXT416(uVar3),ZEXT416((uint)cVar13));
      auVar45 = vinsertps_avx(ZEXT416((uint)(auVar37._0_4_ + (worldTransform->m_origin).m_floats[0])
                                     ),ZEXT416((uint)(auVar45._0_4_ +
                                                     (worldTransform->m_origin).m_floats[1])),0x10);
      local_c8._4_4_ = auVar49._0_4_;
      local_c8._0_4_ = auVar42._0_4_;
      cStack_c0._vptr_cbtInternalTriangleIndexCallback._0_4_ = (uint)(fVar5 + auVar40._0_4_);
      cStack_c0._vptr_cbtInternalTriangleIndexCallback._4_4_ = 0;
      local_b8 = CONCAT44(auVar46._0_4_,auVar38._0_4_);
      local_b0 = (ulong)(uint)(fVar6 + auVar48._0_4_);
      uStack_a8 = CONCAT44(auVar41._0_4_,auVar47._0_4_);
      local_a0 = (ulong)auVar39._0_4_;
      auStack_98 = vinsertps_avx(auVar45,ZEXT416((uint)(auVar43._0_4_ +
                                                       (worldTransform->m_origin).m_floats[2])),0x28
                                );
      (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar27) + 0x30))
                (*(undefined4 *)(*(long *)&shape[4].m_userIndex + -8 + uVar33 * 4),
                 (long *)CONCAT44(extraout_var_10,iVar27),local_c8,local_100);
      uVar33 = uVar33 - 1;
      lVar34 = lVar34 + -0x10;
    } while (1 < uVar33);
    return;
  case 10:
    iVar27 = *(int *)((long)&shape[2]._vptr_cbtCollisionShape + 4);
    uVar33 = (ulong)iVar27;
    local_138 = *(float *)(&shape[1].field_0xc + uVar33 * 4);
    in_XMM0_Da = *(float *)(&shape[1].field_0xc + (long)(iVar27 + 2 + ((iVar27 + 2) / 3) * -3) * 4);
    iVar27 = (*this->_vptr_cbtCollisionWorld[5])(this);
    plVar31 = (long *)CONCAT44(extraout_var_09,iVar27);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar31 + 0xa8);
    break;
  case 0xb:
    in_XMM0_Da = (float)shape[2].m_shapeType;
    local_138 = *(float *)&shape[2].field_0xc;
    uVar29 = *(uint *)((long)&shape[2].m_userPointer + 4);
    iVar27 = (*this->_vptr_cbtCollisionWorld[5])(this);
    plVar31 = (long *)CONCAT44(extraout_var_07,iVar27);
    uVar33 = (ulong)uVar29;
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar31 + 0xb8);
    goto LAB_008aea37;
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x15:
  case 0x16:
    goto switchD_008add2c_caseD_c;
  case 0xd:
    uVar33 = (ulong)*(int *)((long)&shape[2]._vptr_cbtCollisionShape + 4);
    (*shape->_vptr_cbtCollisionShape[0x17])(shape);
    local_138 = (float)*(undefined8 *)&shape[1].field_0xc;
    fStack_134 = (float)((ulong)*(undefined8 *)&shape[1].field_0xc >> 0x20);
    local_128._0_8_ = *(ulong *)((long)&shape[1].m_userPointer + 4);
    uVar54 = 0;
    local_128._8_8_ = 0;
    uVar52 = local_128._0_8_;
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    local_f8._0_4_ = (float)uVar52;
    local_f8._4_4_ = (undefined4)(uVar52 >> 0x20);
    uStack_f0 = uVar54;
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    local_58 = uVar52;
    uStack_50 = uVar54;
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    auVar24._4_4_ = local_f8._4_4_;
    auVar24._0_4_ = (float)local_f8;
    auVar24._8_8_ = uStack_f0;
    auVar45 = vinsertps_avx(auVar24,ZEXT416((uint)local_58),0x10);
    auVar56._0_4_ = auVar45._0_4_ + local_138;
    auVar56._4_4_ = auVar45._4_4_ + fStack_134;
    auVar56._8_4_ = auVar45._8_4_ + 0.0;
    auVar56._12_4_ = auVar45._12_4_ + 0.0;
    auVar45 = vinsertps_avx(ZEXT416((uint)((float)local_128._0_8_ + (float)uVar52)),local_128,0x5c);
    _local_c8 = vmovlhps_avx(auVar56,auVar45);
    local_138 = *(float *)(local_c8 + uVar33 * 4);
    iVar27 = (*this->_vptr_cbtCollisionWorld[5])(this);
    plVar31 = (long *)CONCAT44(extraout_var_11,iVar27);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar31 + 0xb0);
    break;
  case 0x14:
    fVar50 = *(float *)&shape[1].field_0xc;
    in_XMM0_Da = fVar50;
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    in_XMM0_Da = in_XMM0_Da + fVar50;
    uVar33 = *(ulong *)&shape[1].field_0xc;
    uVar52 = uVar33;
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    local_138 = (float)uVar52;
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar33;
    auVar45 = vmovshdup_avx(auVar23);
    local_138 = auVar45._0_4_ + local_138;
    iVar27 = (*this->_vptr_cbtCollisionWorld[5])(this);
    plVar31 = (long *)CONCAT44(extraout_var_08,iVar27);
    uVar33 = 1;
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar31 + 0xb0);
    goto LAB_008aea37;
  case 0x17:
    fVar50 = (worldTransform->m_origin).m_floats[2];
    pdVar19 = *(double **)&shape[2].m_shapeType;
    fVar51 = (worldTransform->m_basis).m_el[0].m_floats[1];
    fVar5 = (worldTransform->m_basis).m_el[1].m_floats[1];
    fVar6 = (worldTransform->m_basis).m_el[2].m_floats[1];
    cVar2 = (worldTransform->m_basis).m_el[0].m_floats[0];
    cVar10 = (worldTransform->m_basis).m_el[1].m_floats[0];
    cVar11 = (worldTransform->m_basis).m_el[2].m_floats[0];
    cVar12 = (worldTransform->m_basis).m_el[0].m_floats[2];
    cVar13 = (worldTransform->m_basis).m_el[1].m_floats[2];
    cVar14 = (worldTransform->m_basis).m_el[2].m_floats[2];
    fVar7 = (worldTransform->m_origin).m_floats[0];
    fVar8 = (worldTransform->m_origin).m_floats[1];
    puVar20 = (ulong *)shape[2].m_userPointer;
    puVar21 = *(ulong **)&shape[2].m_userIndex;
    fVar61 = (float)pdVar19[1];
    auVar59._0_4_ = (float)*pdVar19;
    auVar59._4_12_ = auVar60;
    auVar62._0_4_ = (float)pdVar19[2];
    auVar62._4_12_ = auVar63;
    auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar61)),ZEXT416((uint)cVar2),auVar59);
    auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar61)),ZEXT416((uint)cVar10),auVar59);
    auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar61)),ZEXT416((uint)cVar11),auVar59);
    auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)cVar12),auVar62);
    auVar47 = vfmadd231ss_fma(auVar47,ZEXT416((uint)cVar13),auVar62);
    auVar41 = vfmadd231ss_avx512f(auVar41,ZEXT416((uint)cVar14),auVar62);
    auVar46 = vinsertps_avx(ZEXT416((uint)(auVar46._0_4_ + fVar7)),
                            ZEXT416((uint)(auVar47._0_4_ + fVar8)),0x10);
    _local_c8 = vinsertps_avx(auVar46,ZEXT416((uint)(fVar50 + auVar41._0_4_)),0x28);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = puVar20[1];
    auVar46 = vcvtsd2ss_avx512f(auVar45,auVar37);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = *puVar20;
    auVar47 = vcvtsd2ss_avx512f(auVar45,auVar38);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = puVar20[2];
    auVar41 = vcvtsd2ss_avx512f(auVar45,auVar39);
    auVar42 = vmulss_avx512f(ZEXT416((uint)fVar5),auVar46);
    auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * auVar46._0_4_)),ZEXT416((uint)cVar2),auVar47);
    auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)cVar10),auVar47);
    auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * auVar46._0_4_)),ZEXT416((uint)cVar11),auVar47);
    auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)cVar12),auVar41);
    auVar47 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)cVar13),auVar41);
    auVar46 = vfmadd231ss_avx512f(auVar46,ZEXT416((uint)cVar14),auVar41);
    auVar47 = vaddss_avx512f(ZEXT416((uint)fVar8),auVar47);
    auVar45 = vinsertps_avx(ZEXT416((uint)(auVar45._0_4_ + fVar7)),auVar47,0x10);
    _local_118 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar50 + auVar46._0_4_)),0x28);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = puVar21[1];
    auVar46 = in_ZMM18._0_16_;
    auVar45 = vcvtsd2ss_avx512f(auVar46,auVar40);
    fVar61 = auVar45._0_4_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = *puVar21;
    auVar47 = vcvtsd2ss_avx512f(auVar46,auVar43);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = puVar21[2];
    auVar41 = vcvtsd2ss_avx512f(auVar46,auVar16);
    auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar61)),auVar47,ZEXT416((uint)cVar2));
    auVar45 = vfmadd231ss_fma(auVar45,auVar41,ZEXT416((uint)cVar12));
    auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar61)),auVar47,ZEXT416((uint)cVar10));
    auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar61)),ZEXT416((uint)cVar11),auVar47);
    auVar46 = vfmadd231ss_fma(auVar46,auVar41,ZEXT416((uint)cVar13));
    auVar47 = vfmadd231ss_avx512f(auVar47,ZEXT416((uint)cVar14),auVar41);
    auVar45 = vinsertps_avx(ZEXT416((uint)(fVar7 + auVar45._0_4_)),
                            ZEXT416((uint)(auVar46._0_4_ + fVar8)),0x10);
    local_d8 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar50 + auVar47._0_4_)),0x28);
    iVar27 = (*this->_vptr_cbtCollisionWorld[5])(this);
    (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar27) + 0x48))
              (0x3f800000,(long *)CONCAT44(extraout_var_06,iVar27),local_c8,local_118,local_d8,color
              );
    return;
  default:
    if (iVar27 == 0) {
      uVar54 = *(undefined8 *)&shape[1].field_0xc;
      uVar33 = *(ulong *)((long)&shape[1].m_userPointer + 4);
      uVar53 = 0;
      uVar52 = uVar33;
      (*shape->_vptr_cbtCollisionShape[0xc])(shape);
      local_128._8_8_ = uVar53;
      local_128._0_8_ = uVar52;
      (*shape->_vptr_cbtCollisionShape[0xc])(shape);
      local_f8._0_4_ = (float)uVar52;
      local_f8._4_4_ = (undefined4)(uVar52 >> 0x20);
      uStack_f0 = uVar53;
      (*shape->_vptr_cbtCollisionShape[0xc])(shape);
      auVar45 = vinsertps_avx(local_128,ZEXT416((uint)(float)local_f8),0x10);
      local_148 = (float)uVar54;
      fStack_144 = (float)((ulong)uVar54 >> 0x20);
      auVar42._0_8_ = CONCAT44(auVar45._4_4_ + fStack_144,auVar45._0_4_ + local_148);
      auVar42._8_4_ = auVar45._8_4_ + 0.0;
      auVar42._12_4_ = auVar45._12_4_ + 0.0;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar33;
      fVar50 = (float)uVar33 + (float)uVar52;
      auVar45 = vinsertps_avx(ZEXT416((uint)fVar50),auVar45,0x5c);
      _local_c8 = vmovlhps_avx(auVar42,auVar45);
      iVar27 = (*this->_vptr_cbtCollisionWorld[5])(this);
      auVar41._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
      auVar41._8_4_ = -auVar42._8_4_;
      auVar41._12_4_ = -auVar42._12_4_;
      auVar46._0_8_ = (ulong)(uint)fVar50 ^ 0x8000000080000000;
      auVar46._8_4_ = 0x80000000;
      auVar46._12_4_ = 0x80000000;
      _local_118 = vinsertps_avx(auVar41,auVar46,0x28);
      (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar27) + 0xa0))
                ((long *)CONCAT44(extraout_var_02,iVar27),local_118,local_c8,worldTransform,color);
      return;
    }
    goto switchD_008add2c_caseD_c;
  }
  uVar33 = uVar33 & 0xffffffff;
LAB_008aea37:
  (*UNRECOVERED_JUMPTABLE)
            (in_XMM0_Da,local_138,plVar31,uVar33,worldTransform,color,UNRECOVERED_JUMPTABLE);
  return;
switchD_008add2c_caseD_c:
  local_108 = shape;
  if (iVar27 < 7) {
    lVar34 = *(long *)&shape[2].m_shapeType;
    if (lVar34 == 0) {
      iVar27 = (*shape->_vptr_cbtCollisionShape[0x1a])();
      pcVar26 = local_108;
      if (0 < iVar27) {
        uVar29 = 0;
        do {
          (*pcVar26->_vptr_cbtCollisionShape[0x1b])(pcVar26,(ulong)uVar29,local_c8,local_118);
          fVar50 = (worldTransform->m_basis).m_el[0].m_floats[1];
          fVar51 = (worldTransform->m_basis).m_el[1].m_floats[1];
          fVar5 = (worldTransform->m_basis).m_el[2].m_floats[1];
          fVar6 = (worldTransform->m_origin).m_floats[1];
          fVar7 = (worldTransform->m_origin).m_floats[2];
          auVar42 = ZEXT416((uint)(worldTransform->m_basis).m_el[0].m_floats[0]);
          auVar45 = vfmadd231ss_fma(ZEXT416((uint)((float)local_c8._4_4_ * fVar50)),
                                    ZEXT416((uint)local_c8._0_4_),auVar42);
          auVar38 = ZEXT416((uint)(worldTransform->m_basis).m_el[1].m_floats[0]);
          auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * (float)local_c8._4_4_)),
                                    ZEXT416((uint)local_c8._0_4_),auVar38);
          auVar40 = ZEXT416((uint)(worldTransform->m_basis).m_el[2].m_floats[0]);
          auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (float)local_c8._4_4_)),auVar40,
                                    ZEXT416((uint)local_c8._0_4_));
          auVar37 = ZEXT416((uint)(worldTransform->m_basis).m_el[0].m_floats[2]);
          auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)cStack_c0.
                                                          _vptr_cbtInternalTriangleIndexCallback),
                                    auVar37);
          auVar39 = ZEXT416((uint)(worldTransform->m_basis).m_el[1].m_floats[2]);
          auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)cStack_c0.
                                                          _vptr_cbtInternalTriangleIndexCallback),
                                    auVar39);
          auVar41 = ZEXT416((uint)(worldTransform->m_basis).m_el[2].m_floats[2]);
          auVar47 = vfmadd231ss_fma(auVar47,auVar41,
                                    ZEXT416((uint)cStack_c0._vptr_cbtInternalTriangleIndexCallback))
          ;
          auVar43 = ZEXT416((uint)(worldTransform->m_origin).m_floats[0]);
          auVar45 = vaddss_avx512f(auVar45,auVar43);
          auVar45 = vinsertps_avx(auVar45,ZEXT416((uint)(auVar46._0_4_ + fVar6)),0x10);
          local_d8 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar7 + auVar47._0_4_)),0x28);
          auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * (float)local_118._4_4_)),
                                    ZEXT416((uint)local_118._0_4_),auVar42);
          auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * (float)local_118._4_4_)),
                                    ZEXT416((uint)local_118._0_4_),auVar38);
          auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (float)local_118._4_4_)),
                                    ZEXT416((uint)local_118._0_4_),auVar40);
          auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)uStack_110),auVar39);
          auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)uStack_110),auVar37);
          auVar47 = vfmadd231ss_fma(auVar47,ZEXT416((uint)uStack_110),auVar41);
          auVar45 = vaddss_avx512f(auVar43,auVar45);
          auVar45 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar6 + auVar46._0_4_)),0x10);
          local_40 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar7 + auVar47._0_4_)),0x28);
          iVar27 = (*this->_vptr_cbtCollisionWorld[5])(this);
          (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar27) + 0x20))
                    ((long *)CONCAT44(extraout_var_13,iVar27),local_d8,local_40,color);
          uVar29 = uVar29 + 1;
          iVar27 = (*pcVar26->_vptr_cbtCollisionShape[0x1a])(pcVar26);
        } while ((int)uVar29 < iVar27);
      }
    }
    else if (0 < *(int *)(lVar34 + 0x2c)) {
      uVar33 = 0;
      local_100 = color;
      local_60 = this;
      do {
        lVar30 = *(long *)(lVar34 + 0x38);
        local_48 = uVar33 * 0x30;
        local_e8 = (long)*(int *)(lVar30 + 4 + local_48);
        local_58 = uVar33;
        if (local_e8 < 1) {
          auVar55 = ZEXT816(0);
          fVar50 = 0.0;
        }
        else {
          fVar50 = 0.0;
          lVar36 = 0;
          iVar27 = *(int *)(*(long *)(local_48 + lVar30 + 0x10) + -4 + local_e8 * 4);
          auVar45 = ZEXT816(0);
          lVar25 = uVar33 * 0x30;
          do {
            iVar17 = *(int *)(*(long *)(lVar30 + 0x10 + lVar25) + lVar36 * 4);
            lVar35 = (long)iVar17 * 0x10;
            uVar54 = *(undefined8 *)(*(long *)(lVar34 + 0x18) + 4 + lVar35);
            fVar50 = fVar50 + *(float *)(*(long *)(lVar34 + 0x18) + lVar35);
            auVar55._0_4_ = auVar45._0_4_ + (float)uVar54;
            auVar55._4_4_ = auVar45._4_4_ + (float)((ulong)uVar54 >> 0x20);
            auVar55._8_4_ = auVar45._8_4_ + 0.0;
            auVar55._12_4_ = auVar45._12_4_ + 0.0;
            local_f8 = lVar25;
            iVar28 = (*local_60->_vptr_cbtCollisionWorld[5])();
            lVar30 = *(long *)(lVar34 + 0x18);
            fVar51 = (worldTransform->m_basis).m_el[0].m_floats[1];
            fVar5 = (worldTransform->m_basis).m_el[1].m_floats[1];
            fVar6 = (worldTransform->m_basis).m_el[2].m_floats[1];
            fVar7 = (worldTransform->m_origin).m_floats[1];
            fVar8 = (worldTransform->m_origin).m_floats[2];
            lVar32 = (long)iVar27 * 0x10;
            fVar61 = *(float *)(lVar30 + 4 + lVar32);
            uVar29 = *(uint *)(lVar30 + lVar32);
            uVar9 = *(uint *)(lVar30 + 8 + lVar32);
            auVar42 = ZEXT416((uint)(worldTransform->m_basis).m_el[0].m_floats[0]);
            auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * fVar51)),ZEXT416(uVar29),auVar42);
            auVar38 = ZEXT416((uint)(worldTransform->m_basis).m_el[1].m_floats[0]);
            auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar61)),ZEXT416(uVar29),auVar38);
            auVar40 = ZEXT416((uint)(worldTransform->m_basis).m_el[2].m_floats[0]);
            auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar61)),auVar40,ZEXT416(uVar29));
            auVar37 = ZEXT416((uint)(worldTransform->m_basis).m_el[0].m_floats[2]);
            auVar45 = vfmadd231ss_fma(auVar45,ZEXT416(uVar9),auVar37);
            auVar39 = ZEXT416((uint)(worldTransform->m_basis).m_el[1].m_floats[2]);
            auVar46 = vfmadd231ss_fma(auVar46,ZEXT416(uVar9),auVar39);
            auVar41 = ZEXT416((uint)(worldTransform->m_basis).m_el[2].m_floats[2]);
            auVar47 = vfmadd231ss_fma(auVar47,auVar41,ZEXT416(uVar9));
            auVar43 = ZEXT416((uint)(worldTransform->m_origin).m_floats[0]);
            auVar45 = vaddss_avx512f(auVar45,auVar43);
            auVar45 = vinsertps_avx(auVar45,ZEXT416((uint)(auVar46._0_4_ + fVar7)),0x10);
            _local_c8 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar8 + auVar47._0_4_)),0x28);
            fVar61 = *(float *)(lVar30 + 4 + lVar35);
            uVar29 = *(uint *)(lVar30 + lVar35);
            uVar9 = *(uint *)(lVar30 + 8 + lVar35);
            auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar61)),ZEXT416(uVar29),auVar42);
            auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar61)),ZEXT416(uVar29),auVar38);
            auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar61)),ZEXT416(uVar29),auVar40);
            auVar46 = vfmadd231ss_fma(auVar46,ZEXT416(uVar9),auVar39);
            auVar45 = vfmadd231ss_fma(auVar45,ZEXT416(uVar9),auVar37);
            auVar47 = vfmadd231ss_fma(auVar47,ZEXT416(uVar9),auVar41);
            auVar45 = vaddss_avx512f(auVar43,auVar45);
            auVar45 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar7 + auVar46._0_4_)),0x10);
            _local_118 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar8 + auVar47._0_4_)),0x28);
            (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar28) + 0x20))
                      ((long *)CONCAT44(extraout_var_03,iVar28),local_c8,local_118,local_100);
            lVar30 = *(long *)(lVar34 + 0x38);
            lVar36 = lVar36 + 1;
            piVar1 = (int *)(lVar30 + 4 + lVar25);
            iVar27 = iVar17;
            auVar45 = auVar55;
            lVar25 = local_f8;
          } while (lVar36 < *piVar1);
        }
        this = local_60;
        iVar27 = (*local_60->_vptr_cbtCollisionWorld[5])(local_60);
        uVar29 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar27) + 0x70))
                           ((long *)CONCAT44(extraout_var_04,iVar27));
        if ((uVar29 >> 0xe & 1) != 0) {
          auVar45 = vcvtsi2ss_avx512f(in_ZMM20._0_16_,(uint)local_e8);
          fVar51 = 1.0 / auVar45._0_4_;
          auVar45 = vmovshdup_avx(auVar55);
          local_f8._0_4_ = fVar51 * auVar45._0_4_;
          local_dc = fVar51 * auVar55._0_4_;
          _local_c8 = ZEXT816(0x3f8000003f800000);
          lVar30 = *(long *)(lVar34 + 0x38);
          local_e8 = CONCAT44(local_e8._4_4_,fVar51 * fVar50);
          fVar8 = fVar51 * fVar50 + *(float *)(lVar30 + 0x20 + local_48);
          fVar61 = local_dc + *(float *)(lVar30 + 0x24 + local_48);
          fVar22 = (float)local_f8 + *(float *)(lVar30 + 0x28 + local_48);
          iVar27 = (*this->_vptr_cbtCollisionWorld[5])(this);
          fVar50 = (worldTransform->m_basis).m_el[0].m_floats[1];
          fVar51 = (worldTransform->m_basis).m_el[1].m_floats[1];
          fVar5 = (worldTransform->m_origin).m_floats[1];
          fVar6 = (worldTransform->m_origin).m_floats[2];
          fVar7 = (worldTransform->m_basis).m_el[2].m_floats[1];
          auVar41 = ZEXT416((uint)(worldTransform->m_basis).m_el[0].m_floats[0]);
          auVar45 = vfmadd231ss_fma(ZEXT416((uint)(local_dc * fVar50)),ZEXT416((uint)local_e8),
                                    auVar41);
          auVar37 = ZEXT416((uint)(worldTransform->m_basis).m_el[1].m_floats[0]);
          auVar46 = vfmadd231ss_fma(ZEXT416((uint)(local_dc * fVar51)),ZEXT416((uint)local_e8),
                                    auVar37);
          auVar42 = ZEXT416((uint)(worldTransform->m_basis).m_el[0].m_floats[2]);
          auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)(float)local_f8),auVar42);
          auVar43 = ZEXT416((uint)(worldTransform->m_basis).m_el[1].m_floats[2]);
          auVar46 = vfmadd231ss_avx512f(auVar46,ZEXT416((uint)(float)local_f8),auVar43);
          auVar40 = ZEXT416((uint)(worldTransform->m_basis).m_el[2].m_floats[0]);
          auVar47 = vfmadd231ss_avx512f(ZEXT416((uint)(local_dc * fVar7)),auVar40,
                                        ZEXT416((uint)local_e8));
          auVar38 = ZEXT416((uint)(worldTransform->m_origin).m_floats[0]);
          auVar45 = vaddss_avx512f(auVar45,auVar38);
          auVar45 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar5 + auVar46._0_4_)),0x10);
          auVar39 = ZEXT416((uint)(worldTransform->m_basis).m_el[2].m_floats[2]);
          auVar46 = vfmadd231ss_avx512f(auVar47,auVar39,ZEXT416((uint)(float)local_f8));
          _local_118 = vinsertps_avx(auVar45,ZEXT416((uint)(auVar46._0_4_ + fVar6)),0x28);
          auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * fVar50)),ZEXT416((uint)fVar8),auVar41);
          auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * fVar51)),ZEXT416((uint)fVar8),auVar37);
          auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar22),auVar42);
          auVar47 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar61 * fVar7)),ZEXT416((uint)fVar8),auVar40
                                       );
          auVar46 = vfmadd231ss_avx512f(auVar46,ZEXT416((uint)fVar22),auVar43);
          auVar45 = vaddss_avx512f(auVar45,auVar38);
          auVar47 = vfmadd231ss_avx512f(auVar47,ZEXT416((uint)fVar22),auVar39);
          auVar45 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar5 + auVar46._0_4_)),0x10);
          local_d8 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar6 + auVar47._0_4_)),0x28);
          (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar27) + 0x20))
                    ((long *)CONCAT44(extraout_var_05,iVar27),local_118,local_d8,local_c8);
        }
        uVar33 = local_58 + 1;
        color = local_100;
      } while ((long)uVar33 < (long)*(int *)(lVar34 + 0x2c));
    }
  }
  iVar27 = local_108->m_shapeType;
  if (iVar27 - 0x19U < 0xb) {
    local_118 = (undefined1  [8])0x5d5e0b6b5d5e0b6b;
    uStack_110 = 0x5d5e0b6b;
    local_d8._0_8_ = 0xdd5e0b6bdd5e0b6b;
    local_d8._8_8_ = 0xdd5e0b6b;
    iVar27 = (*this->_vptr_cbtCollisionWorld[5])(this);
    pcVar26 = local_108;
    local_b8 = CONCAT44(extraout_var_14,iVar27);
    cStack_c0._vptr_cbtInternalTriangleIndexCallback =
         (_func_int **)&PTR__DebugDrawcallback_00b481e0;
    local_c8 = (undefined1  [8])&PTR__DebugDrawcallback_00b481b0;
    local_b0 = *(ulong *)color->m_floats;
    uStack_a8 = *(undefined8 *)(color->m_floats + 2);
    local_a0 = *(ulong *)(worldTransform->m_basis).m_el[0].m_floats;
    auStack_98 = *(undefined1 (*) [16])((worldTransform->m_basis).m_el[0].m_floats + 2);
    uStack_88 = *(undefined8 *)((worldTransform->m_basis).m_el[1].m_floats + 2);
    local_80 = *(undefined8 *)(worldTransform->m_basis).m_el[2].m_floats;
    uStack_78 = *(undefined8 *)((worldTransform->m_basis).m_el[2].m_floats + 2);
    local_70 = *(undefined8 *)(worldTransform->m_origin).m_floats;
    uStack_68 = *(undefined8 *)((worldTransform->m_origin).m_floats + 2);
    (*local_108->_vptr_cbtCollisionShape[0x10])(local_108,local_c8,local_d8,local_118);
    cbtInternalTriangleIndexCallback::~cbtInternalTriangleIndexCallback
              ((cbtInternalTriangleIndexCallback *)(local_c8 + 8));
    cbtTriangleCallback::~cbtTriangleCallback((cbtTriangleCallback *)local_c8);
    iVar27 = pcVar26->m_shapeType;
  }
  pcVar26 = local_108;
  if (iVar27 == 3) {
    uStack_110 = 0x5d5e0b6b;
    local_118 = (undefined1  [8])0x5d5e0b6b5d5e0b6b;
    local_d8._8_8_ = 0xdd5e0b6b;
    local_d8._0_8_ = 0xdd5e0b6bdd5e0b6b;
    iVar27 = (*this->_vptr_cbtCollisionWorld[5])();
    local_b8 = CONCAT44(extraout_var_15,iVar27);
    cStack_c0._vptr_cbtInternalTriangleIndexCallback =
         (_func_int **)&PTR__DebugDrawcallback_00b481e0;
    local_c8 = (undefined1  [8])&PTR__DebugDrawcallback_00b481b0;
    local_b0 = *(ulong *)color->m_floats;
    uStack_a8 = *(undefined8 *)(color->m_floats + 2);
    local_a0 = *(ulong *)(worldTransform->m_basis).m_el[0].m_floats;
    auStack_98 = *(undefined1 (*) [16])((worldTransform->m_basis).m_el[0].m_floats + 2);
    uStack_88 = *(undefined8 *)((worldTransform->m_basis).m_el[1].m_floats + 2);
    local_80 = *(undefined8 *)(worldTransform->m_basis).m_el[2].m_floats;
    uStack_78 = *(undefined8 *)((worldTransform->m_basis).m_el[2].m_floats + 2);
    local_70 = *(undefined8 *)(worldTransform->m_origin).m_floats;
    uStack_68 = *(undefined8 *)((worldTransform->m_origin).m_floats + 2);
    (**(code **)(**(long **)&pcVar26[3].m_userIndex + 0x10))
              (*(long **)&pcVar26[3].m_userIndex,(cbtInternalTriangleIndexCallback *)(local_c8 + 8),
               local_d8,local_118);
    cbtInternalTriangleIndexCallback::~cbtInternalTriangleIndexCallback
              ((cbtInternalTriangleIndexCallback *)(local_c8 + 8));
    cbtTriangleCallback::~cbtTriangleCallback((cbtTriangleCallback *)local_c8);
  }
  return;
}

Assistant:

void cbtCollisionWorld::debugDrawObject(const cbtTransform& worldTransform, const cbtCollisionShape* shape, const cbtVector3& color)
{
	// Draw a small simplex at the center of the object
	if (getDebugDrawer() && getDebugDrawer()->getDebugMode() & cbtIDebugDraw::DBG_DrawFrames)
	{
        /* ***CHRONO*** Comment out */
		////getDebugDrawer()->drawTransform(worldTransform, .1);
	}

	if (shape->getShapeType() == COMPOUND_SHAPE_PROXYTYPE)
	{
		const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(shape);
		for (int i = compoundShape->getNumChildShapes() - 1; i >= 0; i--)
		{
			cbtTransform childTrans = compoundShape->getChildTransform(i);
			const cbtCollisionShape* colShape = compoundShape->getChildShape(i);
			debugDrawObject(worldTransform * childTrans, colShape, color);
		}
	}
	else
	{
		switch (shape->getShapeType())
		{
			case CE_TRIANGLE_SHAPE_PROXYTYPE:	// ***CHRONO***
			{
				const cbtCEtriangleShape* triShape = static_cast<const cbtCEtriangleShape*>(shape);
				chrono::ChVector<>* v1 = triShape->get_p1();
				chrono::ChVector<>* v2 = triShape->get_p2();
				chrono::ChVector<>* v3 = triShape->get_p3();
				auto origin = worldTransform.getOrigin();
				auto vt1 = origin + worldTransform.getBasis() *  cbtVector3((cbtScalar)v1->x(), (cbtScalar)v1->y(), (cbtScalar)v1->z());
				auto vt2 = origin + worldTransform.getBasis() *  cbtVector3((cbtScalar)v2->x(), (cbtScalar)v2->y(), (cbtScalar)v2->z());
				auto vt3 = origin + worldTransform.getBasis() *  cbtVector3((cbtScalar)v3->x(), (cbtScalar)v3->y(), (cbtScalar)v3->z());
				getDebugDrawer()->drawTriangle(vt1, vt2, vt3,color,1);
				break;
			}
			case BOX_SHAPE_PROXYTYPE:
			{
				const cbtBoxShape* boxShape = static_cast<const cbtBoxShape*>(shape);
				cbtVector3 halfExtents = boxShape->getHalfExtentsWithMargin();
				getDebugDrawer()->drawBox(-halfExtents, halfExtents, worldTransform, color);
				break;
			}

			case SPHERE_SHAPE_PROXYTYPE:
			{
				const cbtSphereShape* sphereShape = static_cast<const cbtSphereShape*>(shape);
				cbtScalar radius = sphereShape->getMargin();  //radius doesn't include the margin, so draw with margin

				getDebugDrawer()->drawSphere(radius, worldTransform, color);
				break;
			}
			case MULTI_SPHERE_SHAPE_PROXYTYPE:
			{
				const cbtMultiSphereShape* multiSphereShape = static_cast<const cbtMultiSphereShape*>(shape);

				cbtTransform childTransform;
				childTransform.setIdentity();

				for (int i = multiSphereShape->getSphereCount() - 1; i >= 0; i--)
				{
					childTransform.setOrigin(multiSphereShape->getSpherePosition(i));
					getDebugDrawer()->drawSphere(multiSphereShape->getSphereRadius(i), worldTransform * childTransform, color);
				}

				break;
			}
			case CAPSULE_SHAPE_PROXYTYPE:
			{
				const cbtCapsuleShape* capsuleShape = static_cast<const cbtCapsuleShape*>(shape);

				cbtScalar radius = capsuleShape->getRadius();
				cbtScalar halfHeight = capsuleShape->getHalfHeight();

				int upAxis = capsuleShape->getUpAxis();
				getDebugDrawer()->drawCapsule(radius, halfHeight, upAxis, worldTransform, color);
				break;
			}
			case CONE_SHAPE_PROXYTYPE:
			{
				const cbtConeShape* coneShape = static_cast<const cbtConeShape*>(shape);
				cbtScalar radius = coneShape->getRadius();  //+coneShape->getMargin();
				cbtScalar height = coneShape->getHeight();  //+coneShape->getMargin();

				int upAxis = coneShape->getConeUpIndex();
				getDebugDrawer()->drawCone(radius, height, upAxis, worldTransform, color);
				break;
			}
			case CYLINDER_SHAPE_PROXYTYPE:
			{
				const cbtCylinderShape* cylinder = static_cast<const cbtCylinderShape*>(shape);
				int upAxis = cylinder->getUpAxis();
				cbtScalar radius = cylinder->getRadius();
				cbtScalar halfHeight = cylinder->getHalfExtentsWithMargin()[upAxis];
				getDebugDrawer()->drawCylinder(radius, halfHeight, upAxis, worldTransform, color);
				break;
			}
            case CYLSHELL_SHAPE_PROXYTYPE: { /* ***CHRONO*** */
                const cbtCylindricalShellShape* cylinder = static_cast<const cbtCylindricalShellShape*>(shape);
				cbtScalar radius = cylinder->getRadius();
                cbtScalar halfHeight = cylinder->getHalfExtentsWithMargin()[1];
                getDebugDrawer()->drawCylinder(radius, halfHeight, 1, worldTransform, color);
                break;
            }
			case STATIC_PLANE_PROXYTYPE:
			{
				const cbtStaticPlaneShape* staticPlaneShape = static_cast<const cbtStaticPlaneShape*>(shape);
				cbtScalar planeConst = staticPlaneShape->getPlaneConstant();
				const cbtVector3& planeNormal = staticPlaneShape->getPlaneNormal();
				getDebugDrawer()->drawPlane(planeNormal, planeConst, worldTransform, color);
				break;
			}
			default:
			{
				/// for polyhedral shapes
				if (shape->isPolyhedral())
				{
					cbtPolyhedralConvexShape* polyshape = (cbtPolyhedralConvexShape*)shape;

					int i;
					if (polyshape->getConvexPolyhedron())
					{
						const cbtConvexPolyhedron* poly = polyshape->getConvexPolyhedron();
						for (i = 0; i < poly->m_faces.size(); i++)
						{
							cbtVector3 centroid(0, 0, 0);
							int numVerts = poly->m_faces[i].m_indices.size();
							if (numVerts)
							{
								int lastV = poly->m_faces[i].m_indices[numVerts - 1];
								for (int v = 0; v < poly->m_faces[i].m_indices.size(); v++)
								{
									int curVert = poly->m_faces[i].m_indices[v];
									centroid += poly->m_vertices[curVert];
									getDebugDrawer()->drawLine(worldTransform * poly->m_vertices[lastV], worldTransform * poly->m_vertices[curVert], color);
									lastV = curVert;
								}
							}
							centroid *= cbtScalar(1.f) / cbtScalar(numVerts);
							if (getDebugDrawer()->getDebugMode() & cbtIDebugDraw::DBG_DrawNormals)
							{
								cbtVector3 normalColor(1, 1, 0);
								cbtVector3 faceNormal(poly->m_faces[i].m_plane[0], poly->m_faces[i].m_plane[1], poly->m_faces[i].m_plane[2]);
								getDebugDrawer()->drawLine(worldTransform * centroid, worldTransform * (centroid + faceNormal), normalColor);
							}
						}
					}
					else
					{
						for (i = 0; i < polyshape->getNumEdges(); i++)
						{
							cbtVector3 a, b;
							polyshape->getEdge(i, a, b);
							cbtVector3 wa = worldTransform * a;
							cbtVector3 wb = worldTransform * b;
							getDebugDrawer()->drawLine(wa, wb, color);
						}
					}
				}

				if (shape->isConcave())
				{
					cbtConcaveShape* concaveMesh = (cbtConcaveShape*)shape;

					///@todo pass camera, for some culling? no -> we are not a graphics lib
					cbtVector3 aabbMax(cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT));
					cbtVector3 aabbMin(cbtScalar(-BT_LARGE_FLOAT), cbtScalar(-BT_LARGE_FLOAT), cbtScalar(-BT_LARGE_FLOAT));

					DebugDrawcallback drawCallback(getDebugDrawer(), worldTransform, color);
					concaveMesh->processAllTriangles(&drawCallback, aabbMin, aabbMax);
				}

				if (shape->getShapeType() == CONVEX_TRIANGLEMESH_SHAPE_PROXYTYPE)
				{
					cbtConvexTriangleMeshShape* convexMesh = (cbtConvexTriangleMeshShape*)shape;
					//todo: pass camera for some culling
					cbtVector3 aabbMax(cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT));
					cbtVector3 aabbMin(cbtScalar(-BT_LARGE_FLOAT), cbtScalar(-BT_LARGE_FLOAT), cbtScalar(-BT_LARGE_FLOAT));
					//DebugDrawcallback drawCallback;
					DebugDrawcallback drawCallback(getDebugDrawer(), worldTransform, color);
					convexMesh->getMeshInterface()->InternalProcessAllTriangles(&drawCallback, aabbMin, aabbMax);
				}
			}
		}
	}
}